

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestEnd
          (PrettyUnitTestResultPrinter *this,TestInfo *test_info)

{
  bool bVar1;
  TestResult *pTVar2;
  char *test_suite;
  char *test;
  undefined8 uVar3;
  TimeInMillis local_40;
  string local_38;
  TestInfo *local_18;
  TestInfo *test_info_local;
  PrettyUnitTestResultPrinter *this_local;
  
  local_18 = test_info;
  test_info_local = (TestInfo *)this;
  pTVar2 = TestInfo::result(test_info);
  bVar1 = TestResult::Passed(pTVar2);
  if (bVar1) {
    ColoredPrintf(COLOR_GREEN,"[       OK ] ");
  }
  else {
    pTVar2 = TestInfo::result(local_18);
    bVar1 = TestResult::Skipped(pTVar2);
    if (bVar1) {
      ColoredPrintf(COLOR_GREEN,"[  SKIPPED ] ");
    }
    else {
      ColoredPrintf(COLOR_RED,"[  FAILED  ] ");
    }
  }
  test_suite = TestInfo::test_suite_name(local_18);
  test = TestInfo::name(local_18);
  PrintTestName(test_suite,test);
  pTVar2 = TestInfo::result(local_18);
  bVar1 = TestResult::Failed(pTVar2);
  if (bVar1) {
    PrintFullTestCommentIfPresent(local_18);
  }
  if ((FLAGS_gtest_print_time & 1) == 0) {
    printf("\n");
  }
  else {
    pTVar2 = TestInfo::result(local_18);
    local_40 = TestResult::elapsed_time(pTVar2);
    StreamableToString<long>(&local_38,&local_40);
    uVar3 = std::__cxx11::string::c_str();
    printf(" (%s ms)\n",uVar3);
    std::__cxx11::string::~string((string *)&local_38);
  }
  fflush(_stdout);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestEnd(const TestInfo& test_info) {
  if (test_info.result()->Passed()) {
    ColoredPrintf(COLOR_GREEN, "[       OK ] ");
  } else if (test_info.result()->Skipped()) {
    ColoredPrintf(COLOR_GREEN, "[  SKIPPED ] ");
  } else {
    ColoredPrintf(COLOR_RED, "[  FAILED  ] ");
  }
  PrintTestName(test_info.test_suite_name(), test_info.name());
  if (test_info.result()->Failed())
    PrintFullTestCommentIfPresent(test_info);

  if (GTEST_FLAG(print_time)) {
    printf(" (%s ms)\n", internal::StreamableToString(
           test_info.result()->elapsed_time()).c_str());
  } else {
    printf("\n");
  }
  fflush(stdout);
}